

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.h
# Opt level: O0

void __thiscall bsplib::Rdma::ActionBuf::~ActionBuf(ActionBuf *this)

{
  ActionBuf *this_local;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->m_get_buffer_offset);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->m_counts);
  std::vector<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>::~vector
            (&this->m_actions);
  return;
}

Assistant:

ActionBuf( int nprocs )
            : m_actions()
            , m_counts( nprocs )
            , m_get_buffer_offset( nprocs )
        {}